

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O0

ares_bool_t opt_retry_cb(char prefix,char *name,ares_bool_t is_true,char *value)

{
  int iVar1;
  ulong uVar2;
  char *value_local;
  ares_bool_t is_true_local;
  char *name_local;
  char prefix_local;
  
  iVar1 = ares_str_isnum(value);
  if (iVar1 != 0) {
    uVar2 = strtoul(value,(char **)0x0,10);
    global_config.opts.tries = uVar2 + 1;
  }
  else {
    snprintf(global_config.error,0x100,"value not numeric");
  }
  name_local._4_4_ = (ares_bool_t)(iVar1 != 0);
  return name_local._4_4_;
}

Assistant:

static ares_bool_t opt_retry_cb(char prefix, const char *name,
                                ares_bool_t is_true, const char *value)
{
  (void)prefix;
  (void)name;
  (void)is_true;

  if (!ares_str_isnum(value)) {
    snprintf(global_config.error, sizeof(global_config.error),
             "value not numeric");
    return ARES_FALSE;
  }

  global_config.opts.tries = strtoul(value, NULL, 10) + 1;
  return ARES_TRUE;
}